

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_Any_parse_json_enum
                 (flatcc_json_parser_t *ctx,char *buf,char *end,int *value_sign,uint64_t *value,
                 int *aggregate)

{
  uint64_t uVar1;
  char *pcVar2;
  bool bVar3;
  uint64_t w;
  char *mark;
  char *unmatched;
  int *aggregate_local;
  uint64_t *value_local;
  int *value_sign_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  uVar1 = flatcc_json_parser_symbol_part(buf,end);
  if (uVar1 < 0x4d6f6e7374657200) {
    if ((uVar1 & 0xffffff0000000000) != 0x416c740000000000) {
      return buf;
    }
    end_local = flatcc_json_parser_match_constant(ctx,buf,end,3,aggregate);
    if (end_local == buf) {
      return buf;
    }
    *value = 4;
    *value_sign = 0;
  }
  else {
    if (uVar1 == 0x4d6f6e7374657232) {
      end_local = flatcc_json_parser_match_constant(ctx,buf,end,8,aggregate);
      if (end_local != buf) {
        *value = 3;
        *value_sign = 0;
        return end_local;
      }
    }
    else {
      end_local = buf;
      if (((uVar1 & 0xffffffffffffff00) == 0x4d6f6e7374657200) &&
         (end_local = flatcc_json_parser_match_constant(ctx,buf,end,7,aggregate), end_local != buf))
      {
        *value = 1;
        *value_sign = 0;
        return end_local;
      }
    }
    if (((uVar1 & 0xffffffff00000000) == 0x4e4f4e4500000000) &&
       (pcVar2 = flatcc_json_parser_match_constant(ctx,end_local,end,4,aggregate),
       bVar3 = pcVar2 != end_local, end_local = pcVar2, bVar3)) {
      *value = 0;
      *value_sign = 0;
    }
    else {
      if (uVar1 != 0x5465737453696d70) {
        return buf;
      }
      uVar1 = flatcc_json_parser_symbol_part(end_local + 8,end);
      if (uVar1 != 0x6c655461626c6557) {
        return buf;
      }
      pcVar2 = end_local + 0x10;
      uVar1 = flatcc_json_parser_symbol_part(pcVar2,end);
      if ((uVar1 & 0xffffffffffffff00) != 0x697468456e756d00) {
        return buf;
      }
      end_local = flatcc_json_parser_match_constant(ctx,pcVar2,end,7,aggregate);
      if (end_local == pcVar2) {
        return buf;
      }
      *value = 2;
      *value_sign = 0;
    }
  }
  return end_local;
}

Assistant:

static const char *MyGame_Example_Any_parse_json_enum(flatcc_json_parser_t *ctx, const char *buf, const char *end,
        int *value_sign, uint64_t *value, int *aggregate)
{
    const char *unmatched = buf;
    const char *mark;
    uint64_t w;

    w = flatcc_json_parser_symbol_part(buf, end);
    if (w < 0x4d6f6e7374657200) { /* branch "Monster" */
        if ((w & 0xffffff0000000000) == 0x416c740000000000) { /* "Alt" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 3, aggregate);
            if (buf != mark) {
                *value = UINT64_C(4), *value_sign = 0;
            } else {
                return unmatched;
            }
        } else { /* "Alt" */
            return unmatched;
        } /* "Alt" */
    } else { /* branch "Monster" */
        if (w == 0x4d6f6e7374657232) { /* "Monster2" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 8, aggregate);
            if (buf != mark) {
                *value = UINT64_C(3), *value_sign = 0;
            } else {
                goto pfguard1;
            }
        } else { /* "Monster2" */
            if ((w & 0xffffffffffffff00) == 0x4d6f6e7374657200) { /* "Monster" */
                buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                if (buf != mark) {
                    *value = UINT64_C(1), *value_sign = 0;
                } else {
                    goto pfguard1;
                }
            } else { /* "Monster" */
                goto pfguard1;
            } /* "Monster" */
        } /* "Monster2" */
        goto endpfguard1;
pfguard1:
        if ((w & 0xffffffff00000000) == 0x4e4f4e4500000000) { /* "NONE" */
            buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 4, aggregate);
            if (buf != mark) {
                *value = UINT64_C(0), *value_sign = 0;
            } else {
                goto pfguard2;
            }
        } else { /* "NONE" */
            goto pfguard2;
        } /* "NONE" */
        goto endpfguard2;
pfguard2:
        if (w == 0x5465737453696d70) { /* descend "TestSimp" */
            buf += 8;
            w = flatcc_json_parser_symbol_part(buf, end);
            if (w == 0x6c655461626c6557) { /* descend "leTableW" */
                buf += 8;
                w = flatcc_json_parser_symbol_part(buf, end);
                if ((w & 0xffffffffffffff00) == 0x697468456e756d00) { /* "ithEnum" */
                    buf = flatcc_json_parser_match_constant(ctx, (mark = buf), end, 7, aggregate);
                    if (buf != mark) {
                        *value = UINT64_C(2), *value_sign = 0;
                    } else {
                        return unmatched;
                    }
                } else { /* "ithEnum" */
                    return unmatched;
                } /* "ithEnum" */
            } else { /* descend "leTableW" */
                return unmatched;
            } /* descend "leTableW" */
        } else { /* descend "TestSimp" */
            return unmatched;
        } /* descend "TestSimp" */
endpfguard2:
        (void)0;
endpfguard1:
        (void)0;
    } /* branch "Monster" */
    return buf;
}